

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strisalphanumeric_s.c
# Opt level: O1

_Bool strisalphanumeric_s(char *dest,rsize_t dmax)

{
  byte bVar1;
  long lVar2;
  rsize_t rVar3;
  errno_t error;
  _Bool _Var4;
  char *msg;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (char *)0x0) {
    msg = "strisalphanumeric_s: dest is null";
    error = 400;
  }
  else if (dmax == 0) {
    msg = "strisalphanumeric_s: dmax is 0";
    error = 0x191;
  }
  else {
    if (dmax < 0x10000001) {
      if (*dest == '\0') {
LAB_00105624:
        _Var4 = false;
      }
      else {
        rVar3 = 0;
        do {
          bVar1 = dest[rVar3];
          _Var4 = true;
          if (bVar1 == 0) break;
          if ((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)))
          goto LAB_00105624;
          rVar3 = rVar3 + 1;
        } while (dmax != rVar3);
      }
      goto LAB_001055df;
    }
    msg = "strisalphanumeric_s: dmax exceeds max";
    error = 0x193;
  }
  _Var4 = false;
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
LAB_001055df:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return _Var4;
}

Assistant:

bool
strisalphanumeric_s (const char *dest, rsize_t dmax)
{
    if (!dest) {
        invoke_safe_str_constraint_handler("strisalphanumeric_s: "
                   "dest is null",
                   NULL, ESNULLP);
        return (false);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strisalphanumeric_s: "
                   "dmax is 0",
                   NULL, ESZEROL);
        return (false);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strisalphanumeric_s: "
                   "dmax exceeds max",
                   NULL, ESLEMAX);
        return (false);
    }

    if (*dest == '\0') {
        return (false);
    }

    while (dmax && *dest) {

        if (( (*dest >= '0') && (*dest <= '9') )  ||
            ( (*dest >= 'a') && (*dest <= 'z') )  ||
            ( (*dest >= 'A') && (*dest <= 'Z') )) {
            dest++;
            dmax--;
        } else {
            return (false);
        }
    }

    return (true);
}